

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arithmetic.h
# Opt level: O2

void gimage::fillGammaMap<unsigned_char>
               (Image<unsigned_char,_gimage::PixelTraits<unsigned_char>_> *map,int depth,int from,
               int to,double g)

{
  ulong uVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  
  uVar1 = 0;
  uVar3 = 0;
  if (0 < from) {
    uVar3 = (ulong)(uint)from;
  }
  for (; (uVar3 != uVar1 && ((long)uVar1 < map->width)); uVar1 = uVar1 + 1) {
    (*map->img[depth])[uVar1] = '\0';
  }
  uVar1 = 0;
  uVar3 = 0;
  if (0 < to) {
    uVar3 = (ulong)(uint)to;
  }
  for (; (uVar3 != uVar1 && ((long)uVar1 < map->width)); uVar1 = uVar1 + 1) {
    dVar4 = pow((double)((int)uVar1 - from) / (double)(to - from),1.0 / g);
    (*map->img[depth])[uVar1] = (uchar)(int)(dVar4 * 255.0);
  }
  for (lVar2 = (long)to; lVar2 < map->width; lVar2 = lVar2 + 1) {
    (*map->img[depth])[lVar2] = 0xff;
  }
  return;
}

Assistant:

void fillGammaMap(Image<T> &map, int depth, int from, int to, double g)
{
  for (int i=0; i<from && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMinValue());
  }

  for (int i=0; i<to && i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, static_cast<T>(map.absMaxValue()*pow(static_cast<double>(i-from)/
                   (to-from), 1.0/g)));
  }

  for (int i=to; i<map.getWidth(); i++)
  {
    map.setLimited(i, 0, depth, map.absMaxValue());
  }
}